

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall front::syntax::SyntaxAnalyze::gm_var_decl(SyntaxAnalyze *this)

{
  bool bVar1;
  Token tk;
  
  tk = INTTK;
  do {
    match_one_word(this,tk);
    gm_var_def(this);
    bVar1 = try_word(this,1,COMMA);
    tk = COMMA;
  } while (bVar1);
  match_one_word(this,SEMICN);
  return;
}

Assistant:

void SyntaxAnalyze::gm_var_decl() {
  match_one_word(Token::INTTK);
  gm_var_def();
  while (try_word(1, Token::COMMA)) {
    match_one_word(Token::COMMA);
    gm_var_def();
  }
  match_one_word(Token::SEMICN);
}